

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

ValueType __thiscall IRBuilderAsmJs::GetSimdValueTypeFromIRType(IRBuilderAsmJs *this,IRType type)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000031;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
    return (ValueType)((ValueType)0x4000).field_0;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                     ,0x1a2e,"((0))","UNREACHED");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetObject(UninitializedObject);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType IRBuilderAsmJs::GetSimdValueTypeFromIRType(IRType type)
{
    switch (type)
    {
    case TySimd128F4:
        return ValueType::Simd;
    case TySimd128D2:
        return ValueType::Simd;
    case TySimd128I2:
        return ValueType::Simd;
    case TySimd128I4:
        return ValueType::Simd;
    case TySimd128I8:
        return ValueType::Simd;
    case TySimd128I16:
        return ValueType::Simd;
    case TySimd128U4:
        return ValueType::Simd;
    case TySimd128U8:
        return ValueType::Simd;
    case TySimd128U16:
        return ValueType::Simd;
    case TySimd128B4:
        return ValueType::Simd;
    case TySimd128B8:
        return ValueType::Simd;
    case TySimd128B16:
        return ValueType::Simd;
    default:
        Assert(UNREACHED);
    }
    return ValueType::GetObject(ObjectType::UninitializedObject);

}